

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<char,char(&)[46],char_const(&)[3],unsigned_short>
          (String *__return_storage_ptr__,kj *this,char *params,char (*params_1) [46],
          char (*params_2) [3],unsigned_short *params_3)

{
  kj local_61;
  CappedArray<char,_8UL> local_60;
  ArrayPtr<const_char> local_50;
  char *local_40;
  size_t local_38;
  
  local_61 = *this;
  local_38 = strlen(params);
  local_40 = params;
  local_50.size_ = strlen(*params_1);
  local_50.ptr = *params_1;
  local_60 = _::Stringifier::operator*((Stringifier *)&_::STR,*(unsigned_short *)*params_2);
  _::
  concat<kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>>
            (__return_storage_ptr__,(_ *)&local_61,(FixedArray<char,_1UL> *)&local_40,&local_50,
             (ArrayPtr<const_char> *)&local_60,(CappedArray<char,_8UL> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}